

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gauss.h
# Opt level: O1

void gimage::gauss<float>(Image<float,_gimage::PixelTraits<float>_> *image,float s)

{
  float *pfVar1;
  long lVar2;
  float *pfVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  float **ppfVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  float fVar11;
  float fVar12;
  GaussKernel kernel;
  ImageFloat tmp;
  GaussKernel local_c8;
  float **local_b0;
  float *local_a8;
  long local_a0;
  float ***local_98;
  float ***local_90;
  Image<float,_gimage::PixelTraits<float>_> *local_88;
  long local_80;
  long local_78;
  long local_70;
  Image<float,_gimage::PixelTraits<float>_> local_68;
  
  local_c8.kernel = (float *)0x0;
  local_c8.kn = 0;
  local_c8.kn2 = 0;
  GaussKernel::set(&local_c8,s);
  lVar2 = image->height;
  if (image->height < image->width) {
    lVar2 = image->width;
  }
  local_68.depth = 0;
  local_68.width = 0;
  local_68.height = 0;
  local_68.n = 0;
  local_68.pixel = (float *)0x0;
  local_68.row = (float **)0x0;
  local_68.img = (float ***)0x0;
  Image<float,_gimage::PixelTraits<float>_>::setSize(&local_68,lVar2,1,1);
  local_80 = (long)image->depth;
  if (0 < local_80) {
    pfVar1 = **local_68.img;
    lVar2 = image->width;
    local_70 = image->height;
    local_90 = image->img;
    local_78 = lVar2 * 4;
    lVar6 = 0;
    do {
      if (0 < local_70) {
        local_a0 = lVar2 - local_c8.kn2;
        local_b0 = local_90[lVar6];
        local_a8 = (float *)-(ulong)(uint)local_c8.kn2;
        lVar9 = 0;
        do {
          if (0 < lVar2) {
            local_98 = image->img;
            lVar10 = 0;
            pfVar3 = local_a8;
            do {
              if (lVar10 < local_a0 && local_c8.kn2 <= lVar10) {
                if (local_c8.kn < 1) {
                  fVar11 = 0.0;
                }
                else {
                  fVar11 = 0.0;
                  lVar4 = 0;
                  do {
                    fVar11 = fVar11 + local_c8.kernel[lVar4] *
                                      local_98[lVar6][lVar9][(int)pfVar3 + lVar4];
                    lVar4 = lVar4 + 1;
                  } while (local_c8.kn != lVar4);
                }
              }
              else {
                fVar11 = NAN;
                if (0 < local_c8.kn) {
                  fVar12 = 0.0;
                  lVar4 = 0;
                  fVar11 = 0.0;
                  do {
                    uVar8 = (int)pfVar3 + (int)lVar4;
                    if ((-1 < (int)uVar8) &&
                       (uVar5 = (ulong)(uVar8 & 0x7fffffff), (long)uVar5 < lVar2)) {
                      fVar12 = fVar12 + local_c8.kernel[lVar4];
                      fVar11 = fVar11 + local_c8.kernel[lVar4] * image->img[lVar6][lVar9][uVar5];
                    }
                    lVar4 = lVar4 + 1;
                  } while (local_c8.kn != lVar4);
                  fVar11 = fVar11 / fVar12;
                }
              }
              pfVar1[lVar10] = fVar11;
              lVar10 = lVar10 + 1;
              pfVar3 = (float *)((long)pfVar3 + 1);
            } while (lVar10 != lVar2);
          }
          if (0 < lVar2) {
            pfVar3 = local_b0[lVar9];
            lVar10 = 0;
            do {
              pfVar3[lVar10] = pfVar1[lVar10];
              lVar10 = lVar10 + 1;
            } while (lVar2 != lVar10);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != local_70);
      }
      if (0 < lVar2) {
        local_a0 = local_70 - local_c8.kn2;
        local_b0 = (float **)-(ulong)(uint)local_c8.kn2;
        lVar9 = 0;
        pfVar3 = *local_90[lVar6];
        do {
          local_a8 = pfVar3;
          if (0 < local_70) {
            local_98 = image->img;
            lVar10 = 0;
            ppfVar7 = local_b0;
            do {
              if (lVar10 < local_a0 && local_c8.kn2 <= lVar10) {
                if (local_c8.kn < 1) {
                  fVar11 = 0.0;
                }
                else {
                  fVar11 = 0.0;
                  lVar4 = 0;
                  do {
                    fVar11 = fVar11 + local_c8.kernel[lVar4] *
                                      local_98[lVar6][(int)ppfVar7 + lVar4][lVar9];
                    lVar4 = lVar4 + 1;
                  } while (local_c8.kn != lVar4);
                }
              }
              else {
                fVar11 = NAN;
                if (0 < local_c8.kn) {
                  fVar12 = 0.0;
                  lVar4 = 0;
                  fVar11 = 0.0;
                  do {
                    uVar8 = (int)ppfVar7 + (int)lVar4;
                    if ((-1 < (int)uVar8) &&
                       (uVar5 = (ulong)(uVar8 & 0x7fffffff), (long)uVar5 < image->height)) {
                      fVar12 = fVar12 + local_c8.kernel[lVar4];
                      fVar11 = fVar11 + local_c8.kernel[lVar4] * image->img[lVar6][uVar5][lVar9];
                    }
                    lVar4 = lVar4 + 1;
                  } while (local_c8.kn != lVar4);
                  fVar11 = fVar11 / fVar12;
                }
              }
              pfVar1[lVar10] = fVar11;
              lVar10 = lVar10 + 1;
              ppfVar7 = (float **)((long)ppfVar7 + 1);
            } while (lVar10 != local_70);
          }
          if (0 < local_70) {
            lVar10 = 0;
            pfVar3 = local_a8;
            do {
              *pfVar3 = pfVar1[lVar10];
              lVar10 = lVar10 + 1;
              pfVar3 = pfVar3 + lVar2;
            } while (local_70 != lVar10);
          }
          lVar9 = lVar9 + 1;
          pfVar3 = local_a8 + 1;
        } while (lVar9 != lVar2);
      }
      lVar6 = lVar6 + 1;
      local_88 = image;
    } while (lVar6 != local_80);
  }
  Image<float,_gimage::PixelTraits<float>_>::~Image(&local_68);
  if (local_c8.kernel != (float *)0x0) {
    operator_delete__(local_c8.kernel);
  }
  return;
}

Assistant:

void gauss(Image<T> &image, float s)
{
  GaussKernel kernel(s);

  ImageFloat tmp(std::max(image.getWidth(), image.getHeight()), 1, 1);
  float *p=tmp.getPtr(0, 0, 0);

  // for all color channels

  for (int d=0; d<image.getDepth(); d++)
  {
    // convolve horizontal in place

    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i++)
      {
        p[i]=kernel.convolveHorizontal(image, i, k, d);
      }

      T *tp=image.getPtr(0, k, d);
      for (long i=0; i<image.getWidth(); i++)
      {
        *tp++=static_cast<T>(p[i]);
      }
    }

    // convolve vertically in place

    for (long i=0; i<image.getWidth(); i++)
    {
      for (long k=0; k<image.getHeight(); k++)
      {
        p[k]=kernel.convolveVertical(image, i, k, d);
      }

      T *tp=image.getPtr(i, 0, d);
      for (long k=0; k<image.getHeight(); k++)
      {
        *tp=static_cast<T>(p[k]);
        tp+=image.getWidth();
      }
    }
  }
}